

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::lu_solve(tetgenmesh *this,double (*lu) [4],int n,int *ps,double *b,int N)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int i;
  long lVar7;
  int iVar8;
  double dVar9;
  double X [4];
  double adStack_58 [5];
  
  if (0 < n) {
    iVar8 = N + n;
    lVar5 = (long)N;
    iVar1 = N + 1;
    iVar2 = iVar1;
    if (iVar1 < iVar8) {
      iVar2 = iVar8;
    }
    memset(adStack_58 + lVar5,0,(ulong)(uint)(iVar2 + ~N) * 8 + 8);
    lVar3 = (long)iVar8;
    lVar4 = lVar5;
    do {
      if (lVar4 < 1) {
        dVar9 = 0.0;
      }
      else {
        dVar9 = 0.0;
        lVar6 = lVar5;
        do {
          dVar9 = dVar9 + lu[ps[lVar4]][lVar6] * adStack_58[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 < lVar4 + lVar5);
      }
      adStack_58[lVar4] = b[ps[lVar4]] - dVar9;
      lVar4 = lVar4 + 1;
    } while (lVar4 < lVar3);
    if (0 < n) {
      lVar4 = (long)N;
      lVar6 = 0;
      lVar5 = lVar3;
      do {
        dVar9 = 0.0;
        lVar7 = lVar6;
        if (lVar5 < lVar3) {
          do {
            dVar9 = dVar9 + lu[ps[lVar5 + -1]][lVar3 + lVar7] * adStack_58[lVar3 + lVar7];
            lVar7 = lVar7 + 1;
          } while ((int)lVar7 != 0);
        }
        lVar7 = lVar5 + -1;
        adStack_58[lVar7] = (adStack_58[lVar7] - dVar9) / lu[(long)ps[lVar5 + -1] + -1][lVar5 + 3];
        lVar6 = lVar6 + -1;
        lVar5 = lVar7;
      } while (lVar4 < lVar7);
      if (0 < n) {
        if (iVar1 < iVar8) {
          iVar1 = iVar8;
        }
        memcpy(b + lVar4,adStack_58 + lVar4,(ulong)(uint)(iVar1 + ~N) * 8 + 8);
      }
    }
  }
  return;
}

Assistant:

void tetgenmesh::lu_solve(REAL lu[4][4], int n, int* ps, REAL* b, int N)
{
  int i, j;
  REAL X[4], dot;

  for (i = N; i < n + N; i++) X[i] = 0.0;

  // Vector reduction using U triangular matrix.
  for (i = N; i < n + N; i++) {
    dot = 0.0;
    for (j = N; j < i + N; j++)
      dot += lu[ps[i]][j] * X[j];
    X[i] = b[ps[i]] - dot;
  }

  // Back substitution, in L triangular matrix.
  for (i = n + N - 1; i >= N; i--) {
    dot = 0.0;
    for (j = i + 1; j < n + N; j++)
      dot += lu[ps[i]][j] * X[j];
    X[i] = (X[i] - dot) / lu[ps[i]][i];
  }

  for (i = N; i < n + N; i++) b[i] = X[i];
}